

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  uint uVar1;
  int iVar2;
  TEdge *pTVar3;
  byte bVar4;
  uint uVar5;
  TEdge *pTVar6;
  uint uVar7;
  
  pTVar3 = edge->PrevInAEL;
  if (pTVar3 != (TEdge *)0x0) {
    do {
      if ((pTVar3->PolyTyp == edge->PolyTyp) && (iVar2 = pTVar3->WindDelta, iVar2 != 0)) {
        uVar5 = edge->WindDelta;
        if ((uVar5 == 0) && (this->m_ClipType != ctUnion)) {
          edge->WindCnt = 1;
        }
        else if ((&this->m_ClipFillType)[edge->PolyTyp == ptSubject] == pftEvenOdd) {
          if (uVar5 == 0) {
            pTVar6 = pTVar3->PrevInAEL;
            if (pTVar6 == (TEdge *)0x0) {
              uVar5 = 0;
            }
            else {
              bVar4 = 1;
              do {
                if (pTVar6->PolyTyp == pTVar3->PolyTyp) {
                  bVar4 = bVar4 ^ pTVar6->WindDelta != 0;
                }
                pTVar6 = pTVar6->PrevInAEL;
              } while (pTVar6 != (TEdge *)0x0);
              uVar5 = (uint)(~bVar4 & 1);
            }
          }
          edge->WindCnt = uVar5;
        }
        else {
          uVar1 = pTVar3->WindCnt;
          if ((int)(uVar1 * iVar2) < 0) {
            uVar7 = -uVar1;
            if (0 < (int)uVar1) {
              uVar7 = uVar1;
            }
            if (1 < uVar7) goto LAB_002db965;
            iVar2 = uVar5 + (uVar5 == 0);
          }
          else if (uVar5 == 0) {
            iVar2 = uVar1 + ((int)uVar1 >> 0x1f | 1U);
          }
          else {
LAB_002db965:
            uVar7 = 0;
            if (-1 < (int)(iVar2 * uVar5)) {
              uVar7 = uVar5;
            }
            iVar2 = uVar1 + uVar7;
          }
          edge->WindCnt = iVar2;
        }
        edge->WindCnt2 = pTVar3->WindCnt2;
        goto LAB_002db990;
      }
      pTVar3 = pTVar3->PrevInAEL;
    } while (pTVar3 != (TEdge *)0x0);
  }
  iVar2 = edge->WindDelta;
  if (iVar2 == 0) {
    iVar2 = (uint)((&this->m_ClipFillType)[edge->PolyTyp == ptSubject] != pftNegative) * 2 + -1;
  }
  edge->WindCnt = iVar2;
  edge->WindCnt2 = 0;
  pTVar3 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
LAB_002db990:
  pTVar3 = pTVar3->NextInAEL;
  if ((&this->m_ClipFillType)[edge->PolyTyp != ptSubject] == pftEvenOdd) {
    if (pTVar3 != edge) {
      uVar5 = edge->WindCnt2;
      do {
        if (pTVar3->WindDelta != 0) {
          uVar5 = (uint)(uVar5 == 0);
          edge->WindCnt2 = uVar5;
        }
        pTVar3 = pTVar3->NextInAEL;
      } while (pTVar3 != edge);
    }
  }
  else if (pTVar3 != edge) {
    iVar2 = edge->WindCnt2;
    do {
      iVar2 = iVar2 + pTVar3->WindDelta;
      pTVar3 = pTVar3->NextInAEL;
    } while (pTVar3 != edge);
    edge->WindCnt2 = iVar2;
    return;
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.PrevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while (e  && ((e->PolyTyp != edge.PolyTyp) || (e->WindDelta == 0))) e = e->PrevInAEL;
  if (!e)
  {
    if (edge.WindDelta == 0)
    {
      PolyFillType pft = (edge.PolyTyp == ptSubject ? m_SubjFillType : m_ClipFillType);
      edge.WindCnt = (pft == pftNegative ? -1 : 1);
    }
    else
      edge.WindCnt = edge.WindDelta;
    edge.WindCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc WindCnt2
  }   
  else if (edge.WindDelta == 0 && m_ClipType != ctUnion)
  {
    edge.WindCnt = 1;
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }
  else if (IsEvenOddFillType(edge))
  {
    //EvenOdd filling ...
    if (edge.WindDelta == 0)
    {
      //are we inside a subj polygon ...
      bool Inside = true;
      TEdge *e2 = e->PrevInAEL;
      while (e2)
      {
        if (e2->PolyTyp == e->PolyTyp && e2->WindDelta != 0) 
          Inside = !Inside;
        e2 = e2->PrevInAEL;
      }
      edge.WindCnt = (Inside ? 0 : 1);
    }
    else
    {
      edge.WindCnt = edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  } 
  else
  {
    //nonZero, Positive or Negative filling ...
    if (e->WindCnt * e->WindDelta < 0)
    {
      //prev edge is 'decreasing' WindCount (WC) toward zero
      //so we're outside the previous polygon ...
      if (Abs(e->WindCnt) > 1)
      {
        //outside prev poly but still inside another.
        //when reversing direction of prev poly use the same WC 
        if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
        //otherwise continue to 'decrease' WC ...
        else edge.WindCnt = e->WindCnt + edge.WindDelta;
      } 
      else
        //now outside all polys of same polytype so set own WC ...
        edge.WindCnt = (edge.WindDelta == 0 ? 1 : edge.WindDelta);
    } else
    {
      //prev edge is 'increasing' WindCount (WC) away from zero
      //so we're inside the previous polygon ...
      if (edge.WindDelta == 0) 
        edge.WindCnt = (e->WindCnt < 0 ? e->WindCnt - 1 : e->WindCnt + 1);
      //if wind direction is reversing prev then use same WC
      else if (e->WindDelta * edge.WindDelta < 0) edge.WindCnt = e->WindCnt;
      //otherwise add to WC ...
      else edge.WindCnt = e->WindCnt + edge.WindDelta;
    }
    edge.WindCnt2 = e->WindCnt2;
    e = e->NextInAEL; //ie get ready to calc WindCnt2
  }

  //update WindCnt2 ...
  if (IsEvenOddAltFillType(edge))
  {
    //EvenOdd filling ...
    while (e != &edge)
    {
      if (e->WindDelta != 0)
        edge.WindCnt2 = (edge.WindCnt2 == 0 ? 1 : 0);
      e = e->NextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.WindCnt2 += e->WindDelta;
      e = e->NextInAEL;
    }
  }
}